

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O0

aiReturn __thiscall aiMaterial::RemoveProperty(aiMaterial *this,char *pKey,uint type,uint index)

{
  aiMaterialProperty *paVar1;
  int iVar2;
  uint local_3c;
  uint a;
  aiMaterialProperty *prop;
  uint i;
  uint index_local;
  uint type_local;
  char *pKey_local;
  aiMaterial *this_local;
  
  if (pKey == (char *)0x0) {
    __assert_fail("nullptr != pKey",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Material/MaterialSystem.cpp"
                  ,0x1ba,
                  "aiReturn aiMaterial::RemoveProperty(const char *, unsigned int, unsigned int)");
  }
  prop._4_4_ = 0;
  while( true ) {
    if (this->mNumProperties <= prop._4_4_) {
      return aiReturn_FAILURE;
    }
    paVar1 = this->mProperties[prop._4_4_];
    if ((((paVar1 != (aiMaterialProperty *)0x0) &&
         (iVar2 = strcmp((paVar1->mKey).data,pKey), iVar2 == 0)) && (paVar1->mSemantic == type)) &&
       (paVar1->mIndex == index)) break;
    prop._4_4_ = prop._4_4_ + 1;
  }
  paVar1 = this->mProperties[prop._4_4_];
  if (paVar1 != (aiMaterialProperty *)0x0) {
    aiMaterialProperty::~aiMaterialProperty(paVar1);
    operator_delete(paVar1,0x420);
  }
  this->mNumProperties = this->mNumProperties - 1;
  for (local_3c = prop._4_4_; local_3c < this->mNumProperties; local_3c = local_3c + 1) {
    this->mProperties[local_3c] = this->mProperties[local_3c + 1];
  }
  return aiReturn_SUCCESS;
}

Assistant:

aiReturn aiMaterial::RemoveProperty ( const char* pKey,unsigned int type, unsigned int index )
{
    ai_assert( nullptr != pKey );

    for (unsigned int i = 0; i < mNumProperties;++i) {
        aiMaterialProperty* prop = mProperties[i];

        if (prop && !strcmp( prop->mKey.data, pKey ) &&
            prop->mSemantic == type && prop->mIndex == index)
        {
            // Delete this entry
            delete mProperties[i];

            // collapse the array behind --.
            --mNumProperties;
            for (unsigned int a = i; a < mNumProperties;++a)    {
                mProperties[a] = mProperties[a+1];
            }
            return AI_SUCCESS;
        }
    }

    return AI_FAILURE;
}